

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

void __thiscall
spvtools::val::Function::RegisterBlockEnd
          (Function *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *next_list)

{
  Function *this_00;
  BasicBlock **__k;
  bool bVar1;
  mapped_type *this_01;
  Construct *this_02;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *pvVar2;
  uint32_t *puVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>,_bool>
  pVar4;
  uint32_t successor_id;
  Function *local_1c0;
  BasicBlock **local_1b8;
  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_1b0;
  __hashtable *__h;
  uint32_t *local_1a0;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> next_blocks;
  BasicBlock *continue_target;
  BasicBlock local_170;
  BasicBlock local_d0;
  
  if (this->current_block_ != (BasicBlock *)0x0) {
    local_1b8 = &this->current_block_;
    next_blocks.
    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    next_blocks.
    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    next_blocks.
    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::reserve
              (&next_blocks,
               (long)(next_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(next_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 2);
    local_1a0 = (next_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_finish;
    __h = &(this->blocks_)._M_h;
    local_1b0 = (_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&this->undefined_blocks_;
    local_1c0 = this;
    for (puVar3 = (next_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start; __k = local_1b8, puVar3 != local_1a0;
        puVar3 = puVar3 + 1) {
      successor_id = *puVar3;
      BasicBlock::BasicBlock(&local_d0,successor_id);
      continue_target = (BasicBlock *)CONCAT44(continue_target._4_4_,successor_id);
      local_170.immediate_structural_dominator_ = local_d0.immediate_structural_dominator_;
      local_170.immediate_structural_post_dominator_ = local_d0.immediate_structural_post_dominator_
      ;
      local_170.id_ = local_d0.id_;
      local_170._4_4_ = local_d0._4_4_;
      local_170.immediate_dominator_ = local_d0.immediate_dominator_;
      local_170.predecessors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_d0.predecessors_.
           super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_170.predecessors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_d0.predecessors_.
           super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_170.predecessors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_d0.predecessors_.
           super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_d0.predecessors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d0.predecessors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d0.predecessors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_170.successors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_d0.successors_.
           super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_170.successors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_d0.successors_.
           super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_170.successors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_d0.successors_.
           super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_d0.successors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d0.successors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d0.successors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_170.label_._0_4_ = local_d0.label_._0_4_;
      local_170.label_._4_4_ = local_d0.label_._4_4_;
      local_170.terminator_._0_4_ = local_d0.terminator_._0_4_;
      local_170.terminator_._4_4_ = local_d0.terminator_._4_4_;
      local_170.type_.super__Base_bitset<1UL>._M_w = local_d0.type_.super__Base_bitset<1UL>._M_w;
      local_170.reachable_ = local_d0.reachable_;
      local_170.structurally_reachable_ = local_d0.structurally_reachable_;
      local_170._90_6_ = local_d0._90_6_;
      local_170.structural_predecessors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_d0.structural_predecessors_.
           super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_170.structural_predecessors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_d0.structural_predecessors_.
           super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_170.structural_predecessors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_d0.structural_predecessors_.
           super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_d0.structural_predecessors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d0.structural_predecessors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d0.structural_predecessors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_170.structural_successors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           local_d0.structural_successors_.
           super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
           ._M_impl.super__Vector_impl_data._M_start._0_4_;
      local_170.structural_successors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start._4_4_ =
           local_d0.structural_successors_.
           super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
           ._M_impl.super__Vector_impl_data._M_start._4_4_;
      local_170.structural_successors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ =
           local_d0.structural_successors_.
           super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
           ._M_impl.super__Vector_impl_data._M_finish._0_4_;
      local_170.structural_successors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ =
           local_d0.structural_successors_.
           super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
           ._M_impl.super__Vector_impl_data._M_finish._4_4_;
      local_170.structural_successors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_d0.structural_successors_.
           super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_d0.structural_successors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d0.structural_successors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d0.structural_successors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pVar4 = std::
              _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::val::BasicBlock>,std::allocator<std::pair<unsigned_int_const,spvtools::val::BasicBlock>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_int_const,spvtools::val::BasicBlock>>
                        ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::val::BasicBlock>,std::allocator<std::pair<unsigned_int_const,spvtools::val::BasicBlock>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)__h,&continue_target);
      BasicBlock::~BasicBlock(&local_170);
      BasicBlock::~BasicBlock(&local_d0);
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::__detail::
        _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert(local_1b0,&successor_id);
      }
      continue_target =
           (BasicBlock *)
           ((long)pVar4.first.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                  ._M_cur.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
           + 0x10);
      std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
      emplace_back<spvtools::val::BasicBlock*>
                ((vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
                 &next_blocks,&continue_target);
    }
    bVar1 = std::bitset<7UL>::test(&(*local_1b8)->type_,2);
    this_00 = local_1c0;
    if (bVar1) {
      this_01 = std::__detail::
                _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&local_1c0->loop_header_successors_plus_continue_target_map_,__k);
      std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
      operator=(this_01,&next_blocks);
      this_02 = FindConstructForEntryBlock(this_00,this_00->current_block_,kLoop);
      pvVar2 = Construct::corresponding_constructs(this_02);
      continue_target =
           Construct::entry_block
                     ((pvVar2->
                      super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish[-1]);
      if (continue_target != this_00->current_block_) {
        std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
        push_back(this_01,&continue_target);
      }
    }
    BasicBlock::RegisterSuccessors
              (*__k,(vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                     *)&next_blocks.
                        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
              );
    *__k = (BasicBlock *)0x0;
    std::_Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
    ~_Vector_base(&next_blocks.
                   super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                 );
    return;
  }
  __assert_fail("current_block_ && \"RegisterBlockEnd can only be called when parsing a binary in a block\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/function.cpp"
                ,0x91,"void spvtools::val::Function::RegisterBlockEnd(std::vector<uint32_t>)");
}

Assistant:

void Function::RegisterBlockEnd(std::vector<uint32_t> next_list) {
  assert(
      current_block_ &&
      "RegisterBlockEnd can only be called when parsing a binary in a block");
  std::vector<BasicBlock*> next_blocks;
  next_blocks.reserve(next_list.size());

  std::unordered_map<uint32_t, BasicBlock>::iterator inserted_block;
  bool success;
  for (uint32_t successor_id : next_list) {
    tie(inserted_block, success) =
        blocks_.insert({successor_id, BasicBlock(successor_id)});
    if (success) {
      undefined_blocks_.insert(successor_id);
    }
    next_blocks.push_back(&inserted_block->second);
  }

  if (current_block_->is_type(kBlockTypeLoop)) {
    // For each loop header, record the set of its successors, and include
    // its continue target if the continue target is not the loop header
    // itself.
    std::vector<BasicBlock*>& next_blocks_plus_continue_target =
        loop_header_successors_plus_continue_target_map_[current_block_];
    next_blocks_plus_continue_target = next_blocks;
    auto continue_target =
        FindConstructForEntryBlock(current_block_, ConstructType::kLoop)
            .corresponding_constructs()
            .back()
            ->entry_block();
    if (continue_target != current_block_) {
      next_blocks_plus_continue_target.push_back(continue_target);
    }
  }

  current_block_->RegisterSuccessors(next_blocks);
  current_block_ = nullptr;
  return;
}